

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O0

void __thiscall QMenuBar::timerEvent(QMenuBar *this,QTimerEvent *e)

{
  int iVar1;
  int iVar2;
  QTimerEvent *in_RDI;
  QMenuBarPrivate *d;
  QAction *in_stack_00000088;
  
  d_func((QMenuBar *)0x65e520);
  iVar1 = QTimerEvent::timerId((QTimerEvent *)0x65e52f);
  iVar2 = QBasicTimer::timerId((QBasicTimer *)0x65e544);
  if (iVar1 == iVar2) {
    QBasicTimer::stop();
    QMenuBarPrivate::setCurrentAction((QMenuBarPrivate *)this,in_stack_00000088,e._7_1_,e._6_1_);
  }
  QObject::timerEvent(in_RDI);
  return;
}

Assistant:

void QMenuBar::timerEvent (QTimerEvent *e)
{
    Q_D(QMenuBar);
    if (e->timerId() == d->autoReleaseTimer.timerId()) {
        d->autoReleaseTimer.stop();
        d->setCurrentAction(nullptr);
    }
    QWidget::timerEvent(e);
}